

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

void console_logging_error(LogPolicy *lp,char *string)

{
  undefined1 local_54 [8];
  termios cf;
  char *string_local;
  LogPolicy *lp_local;
  
  cf._52_8_ = string;
  premsg((termios *)local_54);
  fprintf(_stderr,"%s\n",cf._52_8_);
  fflush(_stderr);
  postmsg((termios *)local_54);
  return;
}

Assistant:

void console_logging_error(LogPolicy *lp, const char *string)
{
    /* Errors setting up logging are considered important, so they're
     * displayed to standard error even when not in verbose mode */
    struct termios cf;
    premsg(&cf);
    fprintf(stderr, "%s\n", string);
    fflush(stderr);
    postmsg(&cf);
}